

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86_avx::create_pipeline_int8(LSTM_x86_avx *this,Option *opt)

{
  Mat *weight_xc;
  Mat *weight_xc_int8_scales;
  Mat *weight_hc;
  Mat *weight_hc_int8_scales;
  Mat *bias_c;
  Mat *this_00;
  Mat *this_01;
  Mat *this_02;
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  uint _h;
  int iVar9;
  int *piVar10;
  Allocator *pAVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  void *pvVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined1 *puVar30;
  long lVar31;
  long lVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  long lVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  long lVar40;
  long lVar41;
  undefined1 *puVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  undefined1 *puVar46;
  long lVar47;
  long lVar48;
  undefined1 *puVar49;
  long lVar50;
  long lVar51;
  undefined4 *puVar52;
  undefined1 *puVar53;
  undefined1 *puVar54;
  undefined1 *puVar55;
  undefined1 *puVar56;
  ulong uVar57;
  uint _c;
  long lVar58;
  int size;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  long local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  
  _c = ((this->super_LSTM).direction == 2) + 1;
  uVar29 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
  _h = (this->super_LSTM).hidden_size;
  lVar27 = (long)(int)_h;
  uVar29 = (long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) / (long)(int)_h;
  weight_xc = &(this->super_LSTM).weight_xc_data;
  weight_xc_int8_scales = &(this->super_LSTM).weight_xc_data_int8_scales;
  weight_hc = &(this->super_LSTM).weight_hc_data;
  weight_hc_int8_scales = &(this->super_LSTM).weight_hc_data_int8_scales;
  bias_c = &(this->super_LSTM).bias_c_data;
  this_00 = &this->weight_data_tm;
  this_01 = &this->weight_data_tm_int8_descales;
  this_02 = &this->bias_c_data_packed;
  iVar9 = (this->super_LSTM).num_output;
  lVar23 = (long)iVar9;
  iVar22 = cpu_support_x86_avx_vnni();
  size = (int)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) / 4);
  if (iVar22 == 0) {
    iVar22 = cpu_support_x86_avx2();
    if (iVar22 == 0) {
      Mat::create(this_00,iVar9 + size,_h,_c,4,4,(Allocator *)0x0);
      uVar57 = 0;
      Mat::create(this_01,8,_h,_c,4,(Allocator *)0x0);
      Mat::create(this_02,_h,1,_c,0x10,4,(Allocator *)0x0);
      lVar50 = (long)size;
      lVar28 = (long)(int)(_h * 3);
      uVar29 = 0;
      if (0 < (int)_h) {
        uVar29 = (ulong)_h;
      }
      lVar24 = (long)(int)(_h * 2);
      for (; uVar57 != _c; uVar57 = uVar57 + 1) {
        lVar31 = (long)(this->super_LSTM).weight_xc_data.w;
        pvVar12 = (this->super_LSTM).weight_xc_data.data;
        sVar13 = (this->super_LSTM).weight_xc_data.elemsize;
        sVar14 = (this->super_LSTM).bias_c_data.elemsize;
        lVar25 = (this->super_LSTM).bias_c_data.cstep * uVar57 * sVar14;
        pvVar15 = (this->weight_data_tm).data;
        sVar16 = (this->weight_data_tm).cstep;
        iVar9 = (this->weight_data_tm_int8_descales).w;
        sVar17 = (this->weight_data_tm_int8_descales).elemsize;
        lVar47 = (this->weight_data_tm_int8_descales).cstep * uVar57 * sVar17;
        lVar58 = (long)(this->super_LSTM).bias_c_data.w * sVar14;
        lVar44 = sVar13 * lVar31;
        lVar45 = (this->super_LSTM).weight_xc_data.cstep * uVar57;
        lVar48 = (lVar28 * lVar31 + lVar45) * sVar13;
        lVar51 = (lVar24 * lVar31 + lVar45) * sVar13;
        lVar31 = (lVar31 * lVar27 + lVar45) * sVar13;
        sVar14 = (this->weight_data_tm).elemsize;
        lVar37 = (long)(this->weight_data_tm).w * sVar14;
        puVar1 = (undefined1 *)((long)pvVar12 + lVar48);
        pvVar26 = (void *)(sVar16 * sVar14 * uVar57 + (long)pvVar15);
        puVar2 = (undefined1 *)((long)pvVar12 + lVar51);
        puVar39 = (undefined1 *)((long)pvVar12 + lVar48 + 1);
        puVar36 = (undefined1 *)((long)pvVar12 + lVar51 + 1);
        puVar3 = (undefined1 *)((long)pvVar12 + lVar31);
        puVar56 = (undefined1 *)((long)pvVar12 + lVar31 + 1);
        puVar4 = (undefined1 *)((long)pvVar12 + lVar45 * sVar13);
        puVar34 = (undefined1 *)((long)pvVar12 + lVar45 * sVar13 + 1);
        lVar31 = (long)(this->super_LSTM).weight_hc_data.w;
        sVar13 = (this->super_LSTM).weight_hc_data.elemsize;
        lVar51 = sVar13 * lVar31;
        lVar32 = (this->super_LSTM).weight_hc_data.cstep * uVar57;
        lVar40 = (lVar28 * lVar31 + lVar32) * sVar13;
        lVar41 = (lVar24 * lVar31 + lVar32) * sVar13;
        lVar31 = (lVar31 * lVar27 + lVar32) * sVar13;
        pvVar12 = (this->super_LSTM).bias_c_data.data;
        lVar45 = (long)(this->super_LSTM).weight_xc_data_int8_scales.w * uVar57 *
                 (this->super_LSTM).weight_xc_data_int8_scales.elemsize;
        pvVar18 = (this->super_LSTM).weight_xc_data_int8_scales.data;
        lVar48 = (long)(this->super_LSTM).weight_hc_data_int8_scales.w * uVar57 *
                 (this->super_LSTM).weight_hc_data_int8_scales.elemsize;
        pvVar19 = (this->super_LSTM).weight_hc_data_int8_scales.data;
        puVar52 = (undefined4 *)
                  ((this->bias_c_data_packed).cstep * uVar57 * (this->bias_c_data_packed).elemsize +
                  (long)(this->bias_c_data_packed).data);
        pvVar20 = (this->weight_data_tm_int8_descales).data;
        pvVar21 = (this->super_LSTM).weight_hc_data.data;
        puVar5 = (undefined1 *)((long)pvVar21 + lVar40);
        local_130 = (undefined1 *)((long)pvVar21 + lVar40 + 1);
        puVar6 = (undefined1 *)((long)pvVar21 + lVar41);
        local_138 = (undefined1 *)((long)pvVar21 + lVar41 + 1);
        puVar7 = (undefined1 *)((long)pvVar21 + lVar31);
        local_140 = (undefined1 *)((long)pvVar21 + lVar31 + 1);
        puVar8 = (undefined1 *)((long)pvVar21 + lVar32 * sVar13);
        local_148 = (undefined1 *)((long)pvVar21 + lVar32 * sVar13 + 1);
        lVar31 = 3;
        local_150 = 3;
        local_210 = puVar7;
        local_208 = puVar8;
        local_200 = puVar5;
        local_1f8 = puVar6;
        local_1f0 = puVar4;
        local_1a0 = puVar1;
        local_198 = puVar2;
        local_190 = puVar3;
        for (uVar43 = 0; uVar43 != uVar29; uVar43 = uVar43 + 1) {
          *puVar52 = *(undefined4 *)((long)pvVar12 + uVar43 * 4 + lVar25);
          puVar52[1] = *(undefined4 *)((long)pvVar12 + uVar43 * 4 + lVar58 + lVar25);
          puVar52[2] = *(undefined4 *)((long)pvVar12 + uVar43 * 4 + lVar58 * 2 + lVar25);
          puVar52[3] = *(undefined4 *)((long)pvVar12 + uVar43 * 4 + lVar58 * 3 + lVar25);
          puVar53 = (undefined1 *)((long)pvVar15 + lVar37 * uVar43 + sVar16 * uVar57 * sVar14);
          puVar30 = puVar39;
          puVar33 = puVar34;
          puVar35 = puVar36;
          puVar38 = local_1a0;
          puVar42 = local_190;
          puVar46 = local_1f0;
          puVar49 = local_198;
          lVar32 = lVar31;
          puVar54 = puVar56;
          for (lVar40 = 0; lVar40 + 7 < lVar50; lVar40 = lVar40 + 8) {
            *(undefined8 *)((long)pvVar26 + lVar40 * 4) = *(undefined8 *)(local_1f0 + lVar40);
            *(undefined8 *)((long)pvVar26 + lVar40 * 4 + 8) = *(undefined8 *)(local_190 + lVar40);
            *(undefined8 *)((long)pvVar26 + lVar40 * 4 + 0x10) = *(undefined8 *)(local_198 + lVar40)
            ;
            *(undefined8 *)((long)pvVar26 + lVar40 * 4 + 0x18) = *(undefined8 *)(local_1a0 + lVar40)
            ;
            puVar53 = puVar53 + 0x20;
            lVar32 = lVar32 + 8;
            puVar30 = puVar30 + 8;
            puVar35 = puVar35 + 8;
            puVar54 = puVar54 + 8;
            puVar33 = puVar33 + 8;
            puVar38 = puVar38 + 8;
            puVar49 = puVar49 + 8;
            puVar42 = puVar42 + 8;
            puVar46 = puVar46 + 8;
          }
          lVar41 = (long)iVar9 * sVar17 * uVar43;
          for (; lVar40 + 3 < lVar50; lVar40 = lVar40 + 4) {
            *puVar53 = puVar4[lVar32 + -3];
            puVar53[1] = puVar4[lVar32 + -2];
            puVar53[2] = puVar4[lVar32 + -1];
            puVar53[3] = puVar4[lVar32];
            puVar53[4] = puVar3[lVar32 + -3];
            puVar53[5] = puVar3[lVar32 + -2];
            puVar53[6] = puVar3[lVar32 + -1];
            puVar53[7] = puVar3[lVar32];
            puVar53[8] = puVar2[lVar32 + -3];
            puVar53[9] = puVar2[lVar32 + -2];
            puVar53[10] = puVar2[lVar32 + -1];
            puVar53[0xb] = puVar2[lVar32];
            puVar53[0xc] = puVar1[lVar32 + -3];
            puVar53[0xd] = puVar1[lVar32 + -2];
            puVar53[0xe] = puVar1[lVar32 + -1];
            puVar53[0xf] = puVar1[lVar32];
            puVar53 = puVar53 + 0x10;
            lVar32 = lVar32 + 4;
            puVar30 = puVar30 + 4;
            puVar35 = puVar35 + 4;
            puVar54 = puVar54 + 4;
            puVar33 = puVar33 + 4;
            puVar38 = puVar38 + 4;
            puVar49 = puVar49 + 4;
            puVar42 = puVar42 + 4;
            puVar46 = puVar46 + 4;
          }
          for (; lVar40 + 1 < lVar50; lVar40 = lVar40 + 2) {
            *puVar53 = puVar33[-1];
            puVar53[1] = *puVar33;
            puVar53[2] = puVar54[-1];
            puVar53[3] = *puVar54;
            puVar53[4] = puVar35[-1];
            puVar53[5] = *puVar35;
            puVar53[6] = puVar30[-1];
            puVar53[7] = *puVar30;
            puVar53 = puVar53 + 8;
            puVar30 = puVar30 + 2;
            puVar35 = puVar35 + 2;
            puVar54 = puVar54 + 2;
            puVar33 = puVar33 + 2;
            puVar38 = puVar38 + 2;
            puVar49 = puVar49 + 2;
            puVar42 = puVar42 + 2;
            puVar46 = puVar46 + 2;
          }
          for (; lVar40 < lVar50; lVar40 = lVar40 + 1) {
            *puVar53 = *puVar46;
            puVar53[1] = *puVar42;
            puVar53[2] = *puVar49;
            puVar53[3] = *puVar38;
            puVar53 = puVar53 + 4;
            puVar38 = puVar38 + 1;
            puVar49 = puVar49 + 1;
            puVar42 = puVar42 + 1;
            puVar46 = puVar46 + 1;
          }
          puVar30 = local_138;
          puVar33 = puVar53;
          puVar35 = local_140;
          puVar38 = local_200;
          lVar32 = local_150;
          puVar42 = local_208;
          puVar46 = local_210;
          puVar49 = local_1f8;
          puVar54 = local_130;
          puVar55 = local_148;
          for (lVar40 = 0; lVar40 + 7 < lVar23; lVar40 = lVar40 + 8) {
            *(undefined8 *)(puVar53 + lVar40 * 4) = *(undefined8 *)(local_208 + lVar40);
            *(undefined8 *)(puVar53 + lVar40 * 4 + 8) = *(undefined8 *)(local_210 + lVar40);
            *(undefined8 *)(puVar53 + lVar40 * 4 + 0x10) = *(undefined8 *)(local_1f8 + lVar40);
            *(undefined8 *)(puVar53 + lVar40 * 4 + 0x18) = *(undefined8 *)(local_200 + lVar40);
            puVar33 = puVar33 + 0x20;
            lVar32 = lVar32 + 8;
            puVar54 = puVar54 + 8;
            puVar30 = puVar30 + 8;
            puVar35 = puVar35 + 8;
            puVar55 = puVar55 + 8;
            puVar38 = puVar38 + 8;
            puVar49 = puVar49 + 8;
            puVar46 = puVar46 + 8;
            puVar42 = puVar42 + 8;
          }
          for (; lVar40 + 3 < lVar23; lVar40 = lVar40 + 4) {
            *puVar33 = puVar8[lVar32 + -3];
            puVar33[1] = puVar8[lVar32 + -2];
            puVar33[2] = puVar8[lVar32 + -1];
            puVar33[3] = puVar8[lVar32];
            puVar33[4] = puVar7[lVar32 + -3];
            puVar33[5] = puVar7[lVar32 + -2];
            puVar33[6] = puVar7[lVar32 + -1];
            puVar33[7] = puVar7[lVar32];
            puVar33[8] = puVar6[lVar32 + -3];
            puVar33[9] = puVar6[lVar32 + -2];
            puVar33[10] = puVar6[lVar32 + -1];
            puVar33[0xb] = puVar6[lVar32];
            puVar33[0xc] = puVar5[lVar32 + -3];
            puVar33[0xd] = puVar5[lVar32 + -2];
            puVar33[0xe] = puVar5[lVar32 + -1];
            puVar33[0xf] = puVar5[lVar32];
            puVar33 = puVar33 + 0x10;
            lVar32 = lVar32 + 4;
            puVar54 = puVar54 + 4;
            puVar30 = puVar30 + 4;
            puVar35 = puVar35 + 4;
            puVar55 = puVar55 + 4;
            puVar38 = puVar38 + 4;
            puVar49 = puVar49 + 4;
            puVar46 = puVar46 + 4;
            puVar42 = puVar42 + 4;
          }
          for (; lVar40 + 1 < lVar23; lVar40 = lVar40 + 2) {
            *puVar33 = puVar55[-1];
            puVar33[1] = *puVar55;
            puVar33[2] = puVar35[-1];
            puVar33[3] = *puVar35;
            puVar33[4] = puVar30[-1];
            puVar33[5] = *puVar30;
            puVar33[6] = puVar54[-1];
            puVar33[7] = *puVar54;
            puVar33 = puVar33 + 8;
            puVar54 = puVar54 + 2;
            puVar30 = puVar30 + 2;
            puVar35 = puVar35 + 2;
            puVar55 = puVar55 + 2;
            puVar38 = puVar38 + 2;
            puVar49 = puVar49 + 2;
            puVar46 = puVar46 + 2;
            puVar42 = puVar42 + 2;
          }
          for (lVar32 = 0; lVar40 + lVar32 < lVar23; lVar32 = lVar32 + 1) {
            puVar33[lVar32 * 4] = *puVar42;
            puVar33[lVar32 * 4 + 1] = *puVar46;
            puVar33[lVar32 * 4 + 2] = *puVar49;
            puVar33[lVar32 * 4 + 3] = *puVar38;
            puVar38 = puVar38 + 1;
            puVar49 = puVar49 + 1;
            puVar46 = puVar46 + 1;
            puVar42 = puVar42 + 1;
          }
          *(float *)((long)pvVar20 + lVar41 + lVar47) =
               1.0 / *(float *)((long)pvVar18 + uVar43 * 4 + lVar45);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 4) =
               1.0 / *(float *)((long)pvVar18 + (uVar43 + lVar27) * 4 + lVar45);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 8) =
               1.0 / *(float *)((long)pvVar18 + (lVar24 + uVar43) * 4 + lVar45);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 0xc) =
               1.0 / *(float *)((long)pvVar18 + (lVar28 + uVar43) * 4 + lVar45);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 0x10) =
               1.0 / *(float *)((long)pvVar19 + uVar43 * 4 + lVar48);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 0x14) =
               1.0 / *(float *)((long)pvVar19 + (uVar43 + lVar27) * 4 + lVar48);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 0x18) =
               1.0 / *(float *)((long)pvVar19 + (lVar24 + uVar43) * 4 + lVar48);
          *(float *)((long)pvVar20 + lVar41 + lVar47 + 0x1c) =
               1.0 / *(float *)((long)pvVar19 + (lVar28 + uVar43) * 4 + lVar48);
          puVar52 = puVar52 + 4;
          local_1a0 = local_1a0 + lVar44;
          local_198 = local_198 + lVar44;
          local_190 = local_190 + lVar44;
          local_1f0 = local_1f0 + lVar44;
          pvVar26 = (void *)((long)pvVar26 + lVar37);
          lVar31 = lVar31 + lVar44;
          puVar39 = puVar39 + lVar44;
          puVar36 = puVar36 + lVar44;
          puVar56 = puVar56 + lVar44;
          puVar34 = puVar34 + lVar44;
          local_200 = local_200 + lVar51;
          local_1f8 = local_1f8 + lVar51;
          local_210 = local_210 + lVar51;
          local_208 = local_208 + lVar51;
          local_150 = local_150 + lVar51;
          local_130 = local_130 + lVar51;
          local_138 = local_138 + lVar51;
          local_140 = local_140 + lVar51;
          local_148 = local_148 + lVar51;
        }
      }
    }
    else {
      lstm_transform_weight_int8_avx2
                (weight_xc,weight_xc_int8_scales,weight_hc,weight_hc_int8_scales,bias_c,this_00,
                 this_01,this_02,size,iVar9,_c,_h,opt);
    }
  }
  else {
    lstm_transform_weight_int8_avxvnni
              (weight_xc,weight_xc_int8_scales,weight_hc,weight_hc_int8_scales,bias_c,this_00,
               this_01,this_02,size,iVar9,_c,_h,opt);
  }
  if (opt->lightmode == true) {
    piVar10 = (this->super_LSTM).weight_xc_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_LSTM).weight_xc_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_xc_data.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
    weight_xc->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data.c = 0;
    (this->super_LSTM).weight_xc_data.dims = 0;
    (this->super_LSTM).weight_xc_data.w = 0;
    (this->super_LSTM).weight_xc_data.h = 0;
    (this->super_LSTM).weight_xc_data.d = 0;
    piVar10 = (this->super_LSTM).bias_c_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_LSTM).bias_c_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_LSTM).bias_c_data.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).bias_c_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
    bias_c->data = (void *)0x0;
    (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
    (this->super_LSTM).bias_c_data.c = 0;
    (this->super_LSTM).bias_c_data.dims = 0;
    (this->super_LSTM).bias_c_data.w = 0;
    (this->super_LSTM).bias_c_data.h = 0;
    (this->super_LSTM).bias_c_data.d = 0;
    piVar10 = (this->super_LSTM).weight_hc_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_LSTM).weight_hc_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_hc_data.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
    weight_hc->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data.c = 0;
    (this->super_LSTM).weight_hc_data.dims = 0;
    (this->super_LSTM).weight_hc_data.w = 0;
    (this->super_LSTM).weight_hc_data.h = 0;
    (this->super_LSTM).weight_hc_data.d = 0;
    piVar10 = (this->super_LSTM).weight_xc_data_int8_scales.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_LSTM).weight_xc_data_int8_scales.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_xc_data_int8_scales.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.elemsize + 4) = 0;
    weight_xc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.c = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.d = 0;
    piVar10 = (this->super_LSTM).weight_hc_data_int8_scales.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_LSTM).weight_hc_data_int8_scales.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_hc_data_int8_scales.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.elemsize + 4) = 0;
    weight_hc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.c = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}